

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

void __thiscall
ParsedH264TrackData::extractData(ParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte bVar1;
  pointer pvVar2;
  int iVar3;
  uint32_t uVar4;
  pointer puVar5;
  uint8_t *puVar6;
  undefined4 *puVar7;
  pointer pvVar8;
  uint uVar9;
  uint32_t *cur32_1;
  uint8_t *start;
  uint32_t *cur32;
  uint32_t *puVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint32_t *puVar13;
  ostringstream ss;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  ulong local_1b0;
  ostringstream local_1a8 [376];
  
  puVar13 = (uint32_t *)(buff + size);
  bVar1 = this->m_firstExtract;
  if ((bool)bVar1 == true) {
    iVar3 = (*(this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData[5])
                      (this,buff,(ulong)(uint)size);
    if ((char)iVar3 != '\0') {
      this->m_firstExtract = false;
      goto LAB_001a0ab8;
    }
    bVar1 = this->m_firstExtract;
  }
  if ((bVar1 & 1) != 0) {
    puVar5 = (pointer)0x0;
    for (pvVar8 = (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 != (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
      puVar5 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               (long)(puVar5 + (4 - (long)(pvVar8->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data._M_start));
    }
    size = size + (int)puVar5;
  }
LAB_001a0ab8:
  uVar12 = (ulong)this->m_nalSize;
  iVar3 = 0;
  puVar10 = (uint32_t *)buff;
  if (buff <= (uint8_t *)((long)puVar13 - uVar12)) {
    iVar3 = 0;
    do {
      if ((char)uVar12 == '\x02') {
        uVar4 = (uint32_t)(ushort)((ushort)*puVar10 << 8 | (ushort)*puVar10 >> 8);
        uVar12 = 2;
      }
      else if ((int)uVar12 == 3) {
        uVar4 = (uint)*(byte *)((long)puVar10 + 2) |
                (uint)*(byte *)((long)puVar10 + 1) << 8 | (uint)(byte)*puVar10 << 0x10;
        uVar12 = 3;
      }
      else {
        if ((int)uVar12 != 4) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported nal unit size ",0x1a);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar7 = 3;
          *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
          if (local_1d0 == &local_1c0) {
            puVar7[6] = local_1c0;
            puVar7[7] = uStack_1bc;
            puVar7[8] = uStack_1b8;
            puVar7[9] = uStack_1b4;
          }
          else {
            *(uint **)(puVar7 + 2) = local_1d0;
            *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1bc,local_1c0);
          }
          *(undefined8 *)(puVar7 + 4) = local_1c8;
          local_1c8 = 0;
          local_1c0 = local_1c0 & 0xffffff00;
          local_1d0 = &local_1c0;
          __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar4 = my_ntohl(*puVar10);
        uVar12 = (ulong)this->m_nalSize;
      }
      iVar3 = iVar3 + 1;
      puVar10 = (uint32_t *)((long)puVar10 + (ulong)(uVar4 + (int)uVar12));
    } while (puVar10 <= (uint32_t *)((long)puVar13 - uVar12));
  }
  if (puVar10 != puVar13) {
    __assert_fail("curPos == end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                  ,0x8d,
                  "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)")
    ;
  }
  iVar3 = (4 - (int)uVar12) * iVar3 + size;
  local_1b0 = uVar12;
  puVar6 = (uint8_t *)operator_new__((long)iVar3);
  pkt->data = puVar6;
  pkt->size = iVar3;
  if (this->m_firstExtract == true) {
    pvVar2 = (this->m_spsPpsList).
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar11 = puVar6;
    for (pvVar8 = (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar2; pvVar8 = pvVar8 + 1)
    {
      puVar11[0] = '\0';
      puVar11[1] = '\0';
      puVar11[2] = '\0';
      puVar11[3] = '\x01';
      puVar5 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar11 + 4,puVar5,
             (long)(pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5);
      puVar11 = puVar11 + (long)((pvVar8->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish +
                                (4 - (long)(pvVar8->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data._M_start));
    }
    puVar6 = puVar6 + ((int)puVar11 - (int)puVar6);
  }
  if (buff <= (uint8_t *)((long)puVar13 - local_1b0)) {
    do {
      if ((char)uVar12 == '\x02') {
        uVar4 = (uint32_t)(ushort)((ushort)*(uint32_t *)buff << 8 | (ushort)*(uint32_t *)buff >> 8);
        uVar12 = 2;
      }
      else if ((int)uVar12 == 3) {
        uVar4 = (uint)*(byte *)((long)buff + 2) |
                (uint)*(byte *)((long)buff + 1) << 8 | (uint)(byte)*(uint32_t *)buff << 0x10;
        uVar12 = 3;
      }
      else {
        if ((int)uVar12 != 4) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported nal unit size ",0x1a);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar7 = 3;
          *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
          if (local_1f0 == &local_1e0) {
            puVar7[6] = local_1e0;
            puVar7[7] = uStack_1dc;
            puVar7[8] = uStack_1d8;
            puVar7[9] = uStack_1d4;
          }
          else {
            *(uint **)(puVar7 + 2) = local_1f0;
            *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1dc,local_1e0);
          }
          *(undefined8 *)(puVar7 + 4) = local_1e8;
          local_1e0 = local_1e0 & 0xffffff00;
          __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar4 = my_ntohl(*(uint32_t *)buff);
        uVar12 = (ulong)this->m_nalSize;
      }
      puVar6[0] = '\0';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\x01';
      if ((char)*(byte *)((long)buff + uVar12) < '\0') {
        __assert_fail("(curPos[m_nalSize] & 0x80) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                      ,0xab,
                      "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                     );
      }
      uVar9 = (int)puVar13 - (int)buff;
      if (uVar4 < uVar9) {
        uVar9 = uVar4;
      }
      memcpy(puVar6 + 4,(byte *)((long)buff + uVar12),(ulong)uVar9);
      buff = (uint8_t *)((long)buff + (ulong)((int)uVar12 + uVar4));
      puVar6 = puVar6 + (ulong)uVar4 + 4;
    } while (buff <= (uint32_t *)((long)puVar13 - uVar12));
  }
  this->m_firstExtract = false;
  return;
}

Assistant:

void ParsedH264TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    int newBufSize = size;
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    int elements = 0;

    if (m_firstExtract && spsppsExists(buff, size))
        m_firstExtract = false;

    if (m_firstExtract)
        newBufSize += static_cast<int>(getSPSPPSLen());

    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        elements++;
        curPos += elSize + m_nalSize;
    }
    assert(curPos == end);
    if (curPos > end)
    {
        LTRACE(LT_ERROR, 2, "Matroska parse error: invalid H264 NAL unit size. NAL unit truncated.");
    }
    newBufSize += elements * (4 - m_nalSize);
    pkt->data = new uint8_t[newBufSize];
    pkt->size = newBufSize;

    uint8_t* dst = pkt->data;
    if (m_firstExtract)
    {
        dst += writeSPSPPS(dst);
    }
    curPos = buff;
    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        writeNalHeader(dst);
        assert((curPos[m_nalSize] & 0x80) == 0);
        memcpy(dst, curPos + m_nalSize, FFMIN(elSize, (uint32_t)(end - curPos)));
        curPos += elSize + m_nalSize;
        dst += elSize;
    }
    m_firstExtract = false;
}